

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
* wasm::WATParser::fields<wasm::WATParser::ParseTypeDefsCtx>
            (Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
             *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  Lexer *this;
  Type TVar1;
  FieldsT *fields;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Name name;
  bool bVar8;
  _Variant_storage<false,_wasm::Field,_wasm::Err> *p_Var9;
  undefined4 uVar10;
  undefined4 uVar11;
  string_view expected;
  FieldT field_00;
  FieldT field_01;
  FieldT field_02;
  undefined1 local_118 [8];
  optional<wasm::Name> id;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined1 local_e0 [8];
  Result<wasm::Field> field;
  FieldsT res;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined1 local_60 [8];
  Result<wasm::Field> _val;
  
  field.val.super__Variant_base<wasm::Field,_wasm::Err>.
  super__Move_assign_alias<wasm::Field,_wasm::Err>.super__Copy_assign_alias<wasm::Field,_wasm::Err>.
  super__Move_ctor_alias<wasm::Field,_wasm::Err>.super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
  super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_index = '\0';
  field.val.super__Variant_base<wasm::Field,_wasm::Err>.
  super__Move_assign_alias<wasm::Field,_wasm::Err>.super__Copy_assign_alias<wasm::Field,_wasm::Err>.
  super__Move_ctor_alias<wasm::Field,_wasm::Err>.super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
  super__Variant_storage_alias<wasm::Field,_wasm::Err>._33_7_ = 0;
  uVar10._0_1_ = '\0';
  uVar10._1_3_ = 0;
  uVar11 = 0;
  if ((ctx->in).pos != (ctx->in).buffer._M_len) {
    this = &ctx->in;
    fields = (FieldsT *)
             ((long)&field.val.super__Variant_base<wasm::Field,_wasm::Err>.
                     super__Move_assign_alias<wasm::Field,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20);
    _val.val.super__Variant_base<wasm::Field,_wasm::Err>.
    super__Move_assign_alias<wasm::Field,_wasm::Err>.
    super__Copy_assign_alias<wasm::Field,_wasm::Err>.super__Move_ctor_alias<wasm::Field,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
    super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_ = __return_storage_ptr__;
    do {
      bVar8 = Lexer::peekRParen(this);
      if (bVar8) break;
      expected._M_str = "field";
      expected._M_len = 5;
      bVar8 = Lexer::takeSExprStart(this,expected);
      if (!bVar8) {
        fieldtype<wasm::WATParser::ParseTypeDefsCtx>((Result<wasm::Field> *)local_e0,ctx);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::Field,_wasm::Err>::_Copy_ctor_base
                  ((_Copy_ctor_base<false,_wasm::Field,_wasm::Err> *)local_60,
                   (_Copy_ctor_base<false,_wasm::Field,_wasm::Err> *)local_e0);
        if (_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
            super__Move_assign_alias<wasm::Field,_wasm::Err>.
            super__Copy_assign_alias<wasm::Field,_wasm::Err>.
            super__Move_ctor_alias<wasm::Field,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
            super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._24_1_ != '\x01') {
          std::__detail::__variant::_Variant_storage<false,_wasm::Field,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Field,_wasm::Err> *)local_60);
          p_Var9 = (_Variant_storage<false,_wasm::Field,_wasm::Err> *)0x0;
          if (field.val.super__Variant_base<wasm::Field,_wasm::Err>.
              super__Move_assign_alias<wasm::Field,_wasm::Err>.
              super__Copy_assign_alias<wasm::Field,_wasm::Err>.
              super__Move_ctor_alias<wasm::Field,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
              super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._24_1_ == '\0') {
            p_Var9 = (_Variant_storage<false,_wasm::Field,_wasm::Err> *)local_e0;
          }
          uVar4 = *(PackedType *)((long)&p_Var9->_M_u + 8);
          uVar7 = *(Mutability *)((long)&p_Var9->_M_u + 0xc);
          field_02.mutable_ = uVar7;
          field_02.packedType = uVar4;
          field_02.type.id = (uintptr_t)local_e0;
          TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::appendField
                    (&ctx->super_TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>,fields,
                     (Name)ZEXT816(0),field_02);
LAB_00bbf50a:
          std::__detail::__variant::_Variant_storage<false,_wasm::Field,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Field,_wasm::Err> *)local_e0);
          goto LAB_00bbf512;
        }
        local_80 = &local_70;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,local_60,
                   (undefined1 *)
                   ((long)_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
                          super__Move_assign_alias<wasm::Field,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._M_first.
                          _M_storage.type.id + (long)local_60));
LAB_00bbf58b:
        __return_storage_ptr__ =
             (Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
              *)_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
                super__Move_assign_alias<wasm::Field,_wasm::Err>.
                super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_;
        *(undefined8 **)
         _val.val.super__Variant_base<wasm::Field,_wasm::Err>.
         super__Move_assign_alias<wasm::Field,_wasm::Err>.
         super__Copy_assign_alias<wasm::Field,_wasm::Err>.
         super__Move_ctor_alias<wasm::Field,_wasm::Err>.
         super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
         super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_ =
             (undefined8 *)
             (_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
              super__Move_assign_alias<wasm::Field,_wasm::Err>.
              super__Copy_assign_alias<wasm::Field,_wasm::Err>.
              super__Move_ctor_alias<wasm::Field,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
              super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_ + 0x10);
        if (local_80 == &local_70) {
          *(undefined8 *)
           (_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
            super__Move_assign_alias<wasm::Field,_wasm::Err>.
            super__Copy_assign_alias<wasm::Field,_wasm::Err>.
            super__Move_ctor_alias<wasm::Field,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
            super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_ + 0x10) = local_70;
          *(undefined8 *)
           (_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
            super__Move_assign_alias<wasm::Field,_wasm::Err>.
            super__Copy_assign_alias<wasm::Field,_wasm::Err>.
            super__Move_ctor_alias<wasm::Field,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
            super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_ + 0x18) = uStack_68;
        }
        else {
          *(undefined8 **)
           _val.val.super__Variant_base<wasm::Field,_wasm::Err>.
           super__Move_assign_alias<wasm::Field,_wasm::Err>.
           super__Copy_assign_alias<wasm::Field,_wasm::Err>.
           super__Move_ctor_alias<wasm::Field,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
           super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_ = local_80;
          *(undefined8 *)
           (_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
            super__Move_assign_alias<wasm::Field,_wasm::Err>.
            super__Copy_assign_alias<wasm::Field,_wasm::Err>.
            super__Move_ctor_alias<wasm::Field,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
            super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_ + 0x10) = local_70;
        }
        *(undefined8 *)
         (_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
          super__Move_assign_alias<wasm::Field,_wasm::Err>.
          super__Copy_assign_alias<wasm::Field,_wasm::Err>.
          super__Move_ctor_alias<wasm::Field,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
          super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_ + 8) = local_78;
        *(undefined1 *)
         (_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
          super__Move_assign_alias<wasm::Field,_wasm::Err>.
          super__Copy_assign_alias<wasm::Field,_wasm::Err>.
          super__Move_ctor_alias<wasm::Field,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
          super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_ + 0x30) = 1;
        std::__detail::__variant::_Variant_storage<false,_wasm::Field,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Field,_wasm::Err> *)local_60);
LAB_00bbf5c8:
        std::__detail::__variant::_Variant_storage<false,_wasm::Field,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Field,_wasm::Err> *)local_e0);
        goto LAB_00bbf5d4;
      }
      Lexer::takeID((optional<wasm::Name> *)local_118,this);
      if (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Name>._M_payload._8_1_ != '\0') {
        fieldtype<wasm::WATParser::ParseTypeDefsCtx>((Result<wasm::Field> *)local_e0,ctx);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::Field,_wasm::Err>::_Copy_ctor_base
                  ((_Copy_ctor_base<false,_wasm::Field,_wasm::Err> *)local_60,
                   (_Copy_ctor_base<false,_wasm::Field,_wasm::Err> *)local_e0);
        if (_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
            super__Move_assign_alias<wasm::Field,_wasm::Err>.
            super__Copy_assign_alias<wasm::Field,_wasm::Err>.
            super__Move_ctor_alias<wasm::Field,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
            super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._24_1_ == '\x01') {
          local_80 = &local_70;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_80,local_60,
                     (undefined1 *)
                     ((long)_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
                            super__Move_assign_alias<wasm::Field,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._M_first.
                            _M_storage.type.id + (long)local_60));
          goto LAB_00bbf58b;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Field,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Field,_wasm::Err> *)local_60);
        bVar8 = Lexer::takeRParen(this);
        if (bVar8) {
          name.super_IString.str._M_str =
               (char *)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.
                       str._M_len;
          name.super_IString.str._M_len = (size_t)local_118;
          p_Var9 = (_Variant_storage<false,_wasm::Field,_wasm::Err> *)0x0;
          if (field.val.super__Variant_base<wasm::Field,_wasm::Err>.
              super__Move_assign_alias<wasm::Field,_wasm::Err>.
              super__Copy_assign_alias<wasm::Field,_wasm::Err>.
              super__Move_ctor_alias<wasm::Field,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
              super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._24_1_ == '\0') {
            p_Var9 = (_Variant_storage<false,_wasm::Field,_wasm::Err> *)local_e0;
          }
          uVar2 = *(PackedType *)((long)&p_Var9->_M_u + 8);
          uVar5 = *(Mutability *)((long)&p_Var9->_M_u + 0xc);
          field_00.mutable_ = uVar5;
          field_00.packedType = uVar2;
          field_00.type.id = (uintptr_t)local_e0;
          TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::appendField
                    (&ctx->super_TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>,fields,name,
                     field_00);
          goto LAB_00bbf50a;
        }
        id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._16_8_ = &local_f0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged,"expected end of field","");
        Lexer::err((Err *)local_60,this,
                   (string *)
                   &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged);
        __return_storage_ptr__ =
             (Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
              *)_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
                super__Move_assign_alias<wasm::Field,_wasm::Err>.
                super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_;
        *(undefined8 **)
         _val.val.super__Variant_base<wasm::Field,_wasm::Err>.
         super__Move_assign_alias<wasm::Field,_wasm::Err>.
         super__Copy_assign_alias<wasm::Field,_wasm::Err>.
         super__Move_ctor_alias<wasm::Field,_wasm::Err>.
         super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
         super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_ =
             (undefined8 *)
             (_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
              super__Move_assign_alias<wasm::Field,_wasm::Err>.
              super__Copy_assign_alias<wasm::Field,_wasm::Err>.
              super__Move_ctor_alias<wasm::Field,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
              super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_ + 0x10);
        TVar1.id = (long)&_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
                          super__Move_assign_alias<wasm::Field,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 8;
        if (local_60 == (undefined1  [8])TVar1.id) {
          *(undefined8 *)
           (_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
            super__Move_assign_alias<wasm::Field,_wasm::Err>.
            super__Copy_assign_alias<wasm::Field,_wasm::Err>.
            super__Move_ctor_alias<wasm::Field,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
            super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_ + 0x10) =
               CONCAT71(_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
                        super__Move_assign_alias<wasm::Field,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._9_7_,
                        _val.val.super__Variant_base<wasm::Field,_wasm::Err>.
                        super__Move_assign_alias<wasm::Field,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._M_first.
                        _M_storage.packedType._0_1_);
          *(undefined8 *)
           (_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
            super__Move_assign_alias<wasm::Field,_wasm::Err>.
            super__Copy_assign_alias<wasm::Field,_wasm::Err>.
            super__Move_ctor_alias<wasm::Field,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
            super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_ + 0x18) =
               _val.val.super__Variant_base<wasm::Field,_wasm::Err>.
               super__Move_assign_alias<wasm::Field,_wasm::Err>.
               super__Copy_assign_alias<wasm::Field,_wasm::Err>.
               super__Move_ctor_alias<wasm::Field,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
               super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           _val.val.super__Variant_base<wasm::Field,_wasm::Err>.
           super__Move_assign_alias<wasm::Field,_wasm::Err>.
           super__Copy_assign_alias<wasm::Field,_wasm::Err>.
           super__Move_ctor_alias<wasm::Field,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
           super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_ = local_60;
          *(ulong *)(_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
                     super__Move_assign_alias<wasm::Field,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_ + 0x10) =
               CONCAT71(_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
                        super__Move_assign_alias<wasm::Field,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._9_7_,
                        _val.val.super__Variant_base<wasm::Field,_wasm::Err>.
                        super__Move_assign_alias<wasm::Field,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._M_first.
                        _M_storage.packedType._0_1_);
        }
        ((Type *)(_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
                  super__Move_assign_alias<wasm::Field,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_ + 8))->id =
             (uintptr_t)
             _val.val.super__Variant_base<wasm::Field,_wasm::Err>.
             super__Move_assign_alias<wasm::Field,_wasm::Err>.
             super__Copy_assign_alias<wasm::Field,_wasm::Err>.
             super__Move_ctor_alias<wasm::Field,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
             super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._M_first._M_storage.type.id;
        _val.val.super__Variant_base<wasm::Field,_wasm::Err>.
        super__Move_assign_alias<wasm::Field,_wasm::Err>.
        super__Copy_assign_alias<wasm::Field,_wasm::Err>.
        super__Move_ctor_alias<wasm::Field,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
        super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._M_first._M_storage.type.id =
             (Type)0;
        _val.val.super__Variant_base<wasm::Field,_wasm::Err>.
        super__Move_assign_alias<wasm::Field,_wasm::Err>.
        super__Copy_assign_alias<wasm::Field,_wasm::Err>.
        super__Move_ctor_alias<wasm::Field,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
        super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._M_first._M_storage.packedType.
        _0_1_ = 0;
        *(undefined1 *)
         (_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
          super__Move_assign_alias<wasm::Field,_wasm::Err>.
          super__Copy_assign_alias<wasm::Field,_wasm::Err>.
          super__Move_ctor_alias<wasm::Field,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
          super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_ + 0x30) = 1;
        local_60 = (undefined1  [8])TVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._16_8_ != &local_f0) {
          operator_delete((void *)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                                  super__Optional_payload_base<wasm::Name>._16_8_,
                          local_f0._M_allocated_capacity + 1);
        }
        goto LAB_00bbf5c8;
      }
      while (bVar8 = Lexer::takeRParen(this), !bVar8) {
        fieldtype<wasm::WATParser::ParseTypeDefsCtx>((Result<wasm::Field> *)local_e0,ctx);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::Field,_wasm::Err>::_Copy_ctor_base
                  ((_Copy_ctor_base<false,_wasm::Field,_wasm::Err> *)local_60,
                   (_Copy_ctor_base<false,_wasm::Field,_wasm::Err> *)local_e0);
        if (_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
            super__Move_assign_alias<wasm::Field,_wasm::Err>.
            super__Copy_assign_alias<wasm::Field,_wasm::Err>.
            super__Move_ctor_alias<wasm::Field,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
            super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._24_1_ == '\x01') {
          local_80 = &local_70;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_80,local_60,
                     (undefined1 *)
                     ((long)_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
                            super__Move_assign_alias<wasm::Field,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._M_first.
                            _M_storage.type.id + (long)local_60));
          goto LAB_00bbf58b;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Field,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Field,_wasm::Err> *)local_60);
        p_Var9 = (_Variant_storage<false,_wasm::Field,_wasm::Err> *)0x0;
        if (field.val.super__Variant_base<wasm::Field,_wasm::Err>.
            super__Move_assign_alias<wasm::Field,_wasm::Err>.
            super__Copy_assign_alias<wasm::Field,_wasm::Err>.
            super__Move_ctor_alias<wasm::Field,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
            super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_u._24_1_ == '\0') {
          p_Var9 = (_Variant_storage<false,_wasm::Field,_wasm::Err> *)local_e0;
        }
        uVar3 = *(PackedType *)((long)&p_Var9->_M_u + 8);
        uVar6 = *(Mutability *)((long)&p_Var9->_M_u + 0xc);
        field_01.mutable_ = uVar6;
        field_01.packedType = uVar3;
        field_01.type.id = (uintptr_t)local_e0;
        TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::appendField
                  (&ctx->super_TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>,fields,
                   (Name)ZEXT816(0),field_01);
        std::__detail::__variant::_Variant_storage<false,_wasm::Field,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Field,_wasm::Err> *)local_e0);
      }
LAB_00bbf512:
    } while ((ctx->in).pos != (ctx->in).buffer._M_len);
    __return_storage_ptr__ =
         (Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
          *)_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
            super__Move_assign_alias<wasm::Field,_wasm::Err>.
            super__Copy_assign_alias<wasm::Field,_wasm::Err>.
            super__Move_ctor_alias<wasm::Field,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
            super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_;
    uVar10 = field.val.super__Variant_base<wasm::Field,_wasm::Err>.
             super__Move_assign_alias<wasm::Field,_wasm::Err>.
             super__Copy_assign_alias<wasm::Field,_wasm::Err>.
             super__Move_ctor_alias<wasm::Field,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
             super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_4_;
    uVar11 = field.val.super__Variant_base<wasm::Field,_wasm::Err>.
             super__Move_assign_alias<wasm::Field,_wasm::Err>.
             super__Copy_assign_alias<wasm::Field,_wasm::Err>.
             super__Move_ctor_alias<wasm::Field,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
             super__Variant_storage_alias<wasm::Field,_wasm::Err>._36_4_;
  }
  *(undefined4 *)
   &(__return_storage_ptr__->val).
    super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
    .
    super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
    .
    super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
    .
    super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
    .
    super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
    .
    super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
       = uVar10;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
           .
           super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
   + 4) = uVar11;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
           .
           super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
   + 8) = 0;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
           .
           super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
   + 0xc) = 0;
  field.val.super__Variant_base<wasm::Field,_wasm::Err>.
  super__Move_assign_alias<wasm::Field,_wasm::Err>.super__Copy_assign_alias<wasm::Field,_wasm::Err>.
  super__Move_ctor_alias<wasm::Field,_wasm::Err>.super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
  super__Variant_storage_alias<wasm::Field,_wasm::Err>._M_index = '\0';
  field.val.super__Variant_base<wasm::Field,_wasm::Err>.
  super__Move_assign_alias<wasm::Field,_wasm::Err>.super__Copy_assign_alias<wasm::Field,_wasm::Err>.
  super__Move_ctor_alias<wasm::Field,_wasm::Err>.super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
  super__Variant_storage_alias<wasm::Field,_wasm::Err>._33_7_ = 0;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
           .
           super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
   + 0x10) = 0;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
           .
           super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
   + 0x14) = 0;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
           .
           super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
   + 0x18) = 0;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
           .
           super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
   + 0x1c) = 0;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
           .
           super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
   + 0x20) = 0;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
           .
           super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
   + 0x24) = 0;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
           .
           super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
   + 0x28) = 0;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
           .
           super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
   + 0x2c) = 0;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>,_wasm::Err>
           .
           super__Move_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_assign_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Move_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
           .
           super__Variant_storage_alias<std::pair<std::vector<wasm::Name>,_std::vector<wasm::Field>_>,_wasm::Err>
   + 0x30) = '\0';
LAB_00bbf5d4:
  if (field.val.super__Variant_base<wasm::Field,_wasm::Err>.
      super__Move_assign_alias<wasm::Field,_wasm::Err>.
      super__Copy_assign_alias<wasm::Field,_wasm::Err>.
      super__Move_ctor_alias<wasm::Field,_wasm::Err>.super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
      super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_ != 0) {
    operator_delete((void *)field.val.super__Variant_base<wasm::Field,_wasm::Err>.
                            super__Move_assign_alias<wasm::Field,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_,
                    -field.val.super__Variant_base<wasm::Field,_wasm::Err>.
                     super__Move_assign_alias<wasm::Field,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Field,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Field,_wasm::Err>._32_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::FieldsT> fields(Ctx& ctx) {
  auto res = ctx.makeFields();
  while (true) {
    if (ctx.in.empty() || ctx.in.peekRParen()) {
      return res;
    }
    if (ctx.in.takeSExprStart("field")) {
      if (auto id = ctx.in.takeID()) {
        auto field = fieldtype(ctx);
        CHECK_ERR(field);
        if (!ctx.in.takeRParen()) {
          return ctx.in.err("expected end of field");
        }
        ctx.appendField(res, *id, *field);
      } else {
        while (!ctx.in.takeRParen()) {
          auto field = fieldtype(ctx);
          CHECK_ERR(field);
          ctx.appendField(res, {}, *field);
        }
      }
    } else {
      auto field = fieldtype(ctx);
      CHECK_ERR(field);
      ctx.appendField(res, {}, *field);
    }
  }
}